

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O0

int SetCurrentLabelEx(char *szFilePath,int CurLbl)

{
  int iVar1;
  FILE *__stream;
  FILE *file;
  int CurLbl_local;
  char *szFilePath_local;
  
  __stream = fopen(szFilePath,"w");
  if (__stream == (FILE *)0x0) {
    printf("Unable to create current label file.\n");
    szFilePath_local._4_4_ = 1;
  }
  else {
    iVar1 = fprintf(__stream,"%d",(ulong)(uint)CurLbl);
    if (iVar1 < 1) {
      printf("Error writing current label file.\n");
      fclose(__stream);
      szFilePath_local._4_4_ = 1;
    }
    else {
      iVar1 = fclose(__stream);
      if (iVar1 == 0) {
        szFilePath_local._4_4_ = 0;
      }
      else {
        printf("Error closing current label file.\n");
        szFilePath_local._4_4_ = 1;
      }
    }
  }
  return szFilePath_local._4_4_;
}

Assistant:

inline int SetCurrentLabelEx(char* szFilePath, int CurLbl)
{

	// Should use an interprocess semaphore...

	FILE* file = NULL;

	file = fopen(szFilePath, "w");
	if (file == NULL)
	{
		printf("Unable to create current label file.\n");
		return EXIT_FAILURE;
	}
	if (fprintf(file, "%d", CurLbl) <= 0)
	{
		printf("Error writing current label file.\n");
		fclose(file);
		return EXIT_FAILURE;
	}
	if (fclose(file) != EXIT_SUCCESS) 
	{
		printf("Error closing current label file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}